

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.cpp
# Opt level: O0

void __thiscall
Diligent::SerializedPipelineStateImpl::
SerializedPipelineStateImpl<Diligent::TilePipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,IReferenceCounters *pRefCounters,
          SerializationDeviceImpl *pDevice,TilePipelineStateCreateInfo *CreateInfo,
          PipelineStateArchiveInfo *ArchiveInfo)

{
  PipelineStateArchiveInfo *ArchiveInfo_00;
  PipelineStateArchiveInfo *PSOCreateInfo;
  bool bVar1;
  ARCHIVE_DEVICE_DATA_FLAGS ValidDeviceFlags;
  PSO_CREATE_FLAGS PVar2;
  IRenderPass *pObj;
  IThreadPool *pIVar3;
  const_iterator __first;
  const_iterator __last;
  reference ppSVar4;
  reference AutoPtr;
  PipelineStateArchiveInfo local_358;
  anon_class_424_4_54625c31_for_Handler local_338;
  RefCntAutoPtr<Diligent::IAsyncTask> pCompileTask;
  iterator __end4;
  iterator __begin4;
  vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
  *__range4;
  SerializedShaderImpl *pShader;
  iterator __end3_1;
  iterator __begin3_1;
  vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
  *__range3_1;
  vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
  ShaderCompileTasks;
  __normal_iterator<const_Diligent::SerializedShaderImpl_**,_std::vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>_>
  local_100;
  const_iterator local_f8;
  reference local_f0;
  SerializedShaderStageInfo *Stage;
  iterator __end3;
  iterator __begin3;
  vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
  *__range3;
  vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
  Shaders;
  undefined1 local_b0 [3];
  bool WaitUntilShadersReady;
  SHADER_TYPE ActiveShaderStages;
  vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
  ShaderStages;
  anon_class_8_1_8991fb9c local_50 [3];
  allocator local_31;
  PipelineStateArchiveInfo *local_30;
  PipelineStateArchiveInfo *ArchiveInfo_local;
  TilePipelineStateCreateInfo *CreateInfo_local;
  SerializationDeviceImpl *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  SerializedPipelineStateImpl *this_local;
  
  local_30 = ArchiveInfo;
  ArchiveInfo_local = (PipelineStateArchiveInfo *)CreateInfo;
  CreateInfo_local = (TilePipelineStateCreateInfo *)pDevice;
  pDevice_local = (SerializationDeviceImpl *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  ObjectBase<Diligent::ISerializedPipelineState>::ObjectBase
            (&this->super_ObjectBase<Diligent::ISerializedPipelineState>,pRefCounters);
  (this->super_ObjectBase<Diligent::ISerializedPipelineState>).
  super_RefCountedObject<Diligent::ISerializedPipelineState>.super_ISerializedPipelineState.
  super_IPipelineState.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_01399f88;
  this->m_pSerializationDevice = (SerializationDeviceImpl *)CreateInfo_local;
  Data::Data(&this->m_Data);
  if (*ArchiveInfo_local == (PipelineStateArchiveInfo)0x0) {
    local_358 = (PipelineStateArchiveInfo)((long)" \t" + 2);
  }
  else {
    local_358 = *ArchiveInfo_local;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_Name,(char *)local_358,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  ShaderStages.
  super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)ArchiveInfo_local;
  local_50[0].this = this;
  SerializedPipelineStateImpl<Diligent::TilePipelineStateCreateInfo>::anon_class_8_1_8991fb9c::
  operator()(&this->m_Desc,local_50,*(PipelineStateDesc *)ArchiveInfo_local);
  pObj = anon_unknown_126::RenderPassFromCI<Diligent::TilePipelineStateCreateInfo>
                   ((TilePipelineStateCreateInfo *)ArchiveInfo_local);
  RefCntAutoPtr<Diligent::IRenderPass>::RefCntAutoPtr(&this->m_pRenderPass,pObj);
  RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::RefCntAutoPtr
            (&this->m_pDefaultSignature);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
  ::vector(&this->m_Signatures);
  std::atomic<Diligent::PIPELINE_STATE_STATUS>::atomic
            (&this->m_Status,PIPELINE_STATE_STATUS_UNINITIALIZED);
  std::unique_ptr<Diligent::AsyncInitializer,std::default_delete<Diligent::AsyncInitializer>>::
  unique_ptr<std::default_delete<Diligent::AsyncInitializer>,void>
            ((unique_ptr<Diligent::AsyncInitializer,std::default_delete<Diligent::AsyncInitializer>>
              *)&this->m_AsyncInitializer);
  if ((*ArchiveInfo_local == (PipelineStateArchiveInfo)0x0) || (*(char *)*ArchiveInfo_local == '\0')
     ) {
    LogError<true,char[54]>
              (false,"SerializedPipelineStateImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x173,(char (*) [54])"Serialized pipeline state name can\'t be null or empty");
  }
  PSOCreateInfo = ArchiveInfo_local;
  ArchiveInfo_00 = local_30;
  ValidDeviceFlags =
       SerializationDeviceImpl::GetSupportedDeviceFlags((SerializationDeviceImpl *)CreateInfo_local)
  ;
  anon_unknown_126::ValidatePipelineStateArchiveInfo
            ((PipelineStateCreateInfo *)PSOCreateInfo,ArchiveInfo_00,ValidDeviceFlags);
  ValidatePSOCreateInfo<Diligent::TilePipelineStateCreateInfo>
            ((IRenderDevice *)CreateInfo_local,(TilePipelineStateCreateInfo *)ArchiveInfo_local);
  std::atomic<Diligent::PIPELINE_STATE_STATUS>::store
            (&this->m_Status,PIPELINE_STATE_STATUS_COMPILING,memory_order_seq_cst);
  PVar2 = Diligent::operator&(ArchiveInfo_local[8].PSOFlags,PSO_CREATE_FLAG_ASYNCHRONOUS);
  if ((PVar2 != PSO_CREATE_FLAG_NONE) &&
     (pIVar3 = RenderDeviceBase<Diligent::SerializationEngineImplTraits>::
               GetShaderCompilationThreadPool
                         ((RenderDeviceBase<Diligent::SerializationEngineImplTraits> *)
                          CreateInfo_local), pIVar3 != (IThreadPool *)0x0)) {
    std::
    vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
    ::vector((vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
              *)local_b0);
    Shaders.
    super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    Shaders.
    super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    PipelineStateUtils::
    ExtractShaders<Diligent::SerializedShaderImpl,std::vector<Diligent::SerializedShaderStageInfo,std::allocator<Diligent::SerializedShaderStageInfo>>>
              ((TilePipelineStateCreateInfo *)ArchiveInfo_local,
               (vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
                *)local_b0,false,
               (SHADER_TYPE *)
               ((long)&Shaders.
                       super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    std::
    vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
    ::vector((vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
              *)&__range3);
    __end3 = std::
             vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
             ::begin((vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
                      *)local_b0);
    Stage = (SerializedShaderStageInfo *)
            std::
            vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
            ::end((vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
                   *)local_b0);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<Diligent::SerializedShaderStageInfo_*,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
                                       *)&Stage), bVar1) {
      local_f0 = __gnu_cxx::
                 __normal_iterator<Diligent::SerializedShaderStageInfo_*,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
                 ::operator*(&__end3);
      local_100._M_current =
           (SerializedShaderImpl **)
           std::
           vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
           ::end((vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                  *)&__range3);
      __gnu_cxx::
      __normal_iterator<Diligent::SerializedShaderImpl_const*const*,std::vector<Diligent::SerializedShaderImpl_const*,std::allocator<Diligent::SerializedShaderImpl_const*>>>
      ::__normal_iterator<Diligent::SerializedShaderImpl_const**>
                ((__normal_iterator<Diligent::SerializedShaderImpl_const*const*,std::vector<Diligent::SerializedShaderImpl_const*,std::allocator<Diligent::SerializedShaderImpl_const*>>>
                  *)&local_f8,&local_100);
      __first = std::
                vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                ::begin(&local_f0->Shaders);
      __last = std::
               vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
               ::end(&local_f0->Shaders);
      ShaderCompileTasks.
      super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<Diligent::SerializedShaderImpl_const*,std::allocator<Diligent::SerializedShaderImpl_const*>>
                    ::
                    insert<__gnu_cxx::__normal_iterator<Diligent::SerializedShaderImpl_const*const*,std::vector<Diligent::SerializedShaderImpl_const*,std::allocator<Diligent::SerializedShaderImpl_const*>>>,void>
                              ((vector<Diligent::SerializedShaderImpl_const*,std::allocator<Diligent::SerializedShaderImpl_const*>>
                                *)&__range3,local_f8,
                               (__normal_iterator<const_Diligent::SerializedShaderImpl_*const_*,_std::vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>_>
                                )__first._M_current,
                               (__normal_iterator<const_Diligent::SerializedShaderImpl_*const_*,_std::vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>_>
                                )__last._M_current);
      __gnu_cxx::
      __normal_iterator<Diligent::SerializedShaderStageInfo_*,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ::vector((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
              *)&__range3_1);
    __end3_1 = std::
               vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
               ::begin((vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                        *)&__range3);
    pShader = (SerializedShaderImpl *)
              std::
              vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
              ::end((vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                     *)&__range3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<const_Diligent::SerializedShaderImpl_**,_std::vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>_>
                               *)&pShader), bVar1) {
      ppSVar4 = __gnu_cxx::
                __normal_iterator<const_Diligent::SerializedShaderImpl_**,_std::vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>_>
                ::operator*(&__end3_1);
      SerializedShaderImpl::GetCompileTasks
                ((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                  *)&__begin4,*ppSVar4);
      __end4 = std::
               vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
               ::begin((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                        *)&__begin4);
      pCompileTask.m_pObject =
           (IAsyncTask *)
           std::
           vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
           ::end((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                  *)&__begin4);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_*,_std::vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>_>
                                         *)&pCompileTask), bVar1) {
        AutoPtr = __gnu_cxx::
                  __normal_iterator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_*,_std::vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>_>
                  ::operator*(&__end4);
        RefCntAutoPtr<Diligent::IAsyncTask>::RefCntAutoPtr
                  ((RefCntAutoPtr<Diligent::IAsyncTask> *)&stack0xfffffffffffffe78,AutoPtr);
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
        ::emplace_back<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
                    *)&__range3_1,(RefCntAutoPtr<Diligent::IAsyncTask> *)&stack0xfffffffffffffe78);
        RefCntAutoPtr<Diligent::IAsyncTask>::~RefCntAutoPtr
                  ((RefCntAutoPtr<Diligent::IAsyncTask> *)&stack0xfffffffffffffe78);
        __gnu_cxx::
        __normal_iterator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_*,_std::vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>_>
        ::operator++(&__end4);
      }
      std::
      vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
      ::~vector((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                 *)&__begin4);
      __gnu_cxx::
      __normal_iterator<const_Diligent::SerializedShaderImpl_**,_std::vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>_>
      ::operator++(&__end3_1);
    }
    pIVar3 = RenderDeviceBase<Diligent::SerializationEngineImplTraits>::
             GetShaderCompilationThreadPool
                       ((RenderDeviceBase<Diligent::SerializationEngineImplTraits> *)
                        CreateInfo_local);
    local_338.this = this;
    std::
    vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
    ::vector(&local_338.Shaders,
             (vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
              *)&__range3);
    TilePipelineStateCreateInfoX::TilePipelineStateCreateInfoX
              (&local_338.CreateInfo,(TilePipelineStateCreateInfo *)ArchiveInfo_local);
    local_338.ArchiveInfo = *local_30;
    AsyncInitializer::
    Start<Diligent::SerializedPipelineStateImpl::SerializedPipelineStateImpl<Diligent::TilePipelineStateCreateInfo>(Diligent::IReferenceCounters*,Diligent::SerializationDeviceImpl*,Diligent::TilePipelineStateCreateInfo_const&,Diligent::PipelineStateArchiveInfo_const&)::_lambda(unsigned_int)_1_>
              ((AsyncInitializer *)&stack0xfffffffffffffe70,pIVar3,
               (vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                *)&__range3_1,&local_338);
    std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    operator=(&this->m_AsyncInitializer,
              (unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
               *)&stack0xfffffffffffffe70);
    std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    ~unique_ptr((unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
                 *)&stack0xfffffffffffffe70);
    SerializedPipelineStateImpl<Diligent::TilePipelineStateCreateInfo>(Diligent::IReferenceCounters*,Diligent::SerializationDeviceImpl*,Diligent::TilePipelineStateCreateInfo_const&,Diligent::PipelineStateArchiveInfo_const&)
    ::{lambda(unsigned_int)#1}::~PipelineStateArchiveInfo((_lambda_unsigned_int__1_ *)&local_338);
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ::~vector((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
               *)&__range3_1);
    std::
    vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
    ::~vector((vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
               *)&__range3);
    std::
    vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
    ::~vector((vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
               *)local_b0);
    return;
  }
  Initialize<Diligent::TilePipelineStateCreateInfo>
            (this,(TilePipelineStateCreateInfo *)ArchiveInfo_local,local_30);
  std::atomic<Diligent::PIPELINE_STATE_STATUS>::store
            (&this->m_Status,PIPELINE_STATE_STATUS_READY,memory_order_seq_cst);
  return;
}

Assistant:

SerializedPipelineStateImpl::SerializedPipelineStateImpl(IReferenceCounters*             pRefCounters,
                                                         SerializationDeviceImpl*        pDevice,
                                                         const PSOCreateInfoType&        CreateInfo,
                                                         const PipelineStateArchiveInfo& ArchiveInfo) :
    TBase{pRefCounters},
    m_pSerializationDevice{pDevice},
    m_Name{CreateInfo.PSODesc.Name != nullptr ? CreateInfo.PSODesc.Name : ""},
    m_Desc //
    {
        [this](PipelineStateDesc Desc) //
        {
            Desc.Name = m_Name.c_str();
            // We don't need resource layout and we don't copy variables and immutable samplers
            Desc.ResourceLayout = {};
            return Desc;
        }(CreateInfo.PSODesc) //
    },
    m_pRenderPass{RenderPassFromCI(CreateInfo)}
{
    if (CreateInfo.PSODesc.Name == nullptr || CreateInfo.PSODesc.Name[0] == '\0')
        LOG_ERROR_AND_THROW("Serialized pipeline state name can't be null or empty");

    ValidatePipelineStateArchiveInfo(CreateInfo, ArchiveInfo, pDevice->GetSupportedDeviceFlags());
    ValidatePSOCreateInfo(pDevice, CreateInfo);

    m_Status.store(PIPELINE_STATE_STATUS_COMPILING);
    if ((CreateInfo.Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) != 0 && pDevice->GetShaderCompilationThreadPool() != nullptr)
    {
        // Collect all asynchronous shader compile tasks
        std::vector<SerializedShaderStageInfo> ShaderStages;
        SHADER_TYPE                            ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
        constexpr bool                         WaitUntilShadersReady = false;
        PipelineStateUtils::ExtractShaders<SerializedShaderImpl>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

        std::vector<const SerializedShaderImpl*> Shaders;
        for (const SerializedShaderStageInfo& Stage : ShaderStages)
        {
            Shaders.insert(Shaders.end(), Stage.Shaders.begin(), Stage.Shaders.end());
        }

        std::vector<RefCntAutoPtr<IAsyncTask>> ShaderCompileTasks;
        for (const SerializedShaderImpl* pShader : Shaders)
        {
            for (RefCntAutoPtr<IAsyncTask> pCompileTask : pShader->GetCompileTasks())
                ShaderCompileTasks.emplace_back(std::move(pCompileTask));
        }

        m_AsyncInitializer = AsyncInitializer::Start(
            pDevice->GetShaderCompilationThreadPool(),
            ShaderCompileTasks, // Make sure that all asynchronous shader compile tasks are completed first
            [this,
#ifdef DILIGENT_DEBUG
             Shaders,
#endif
             CreateInfo = typename PipelineStateCreateInfoXTraits<PSOCreateInfoType>::CreateInfoXType{CreateInfo},
             ArchiveInfo](Uint32 ThreadId) mutable //
            {
#ifdef DILIGENT_DEBUG
                for (const SerializedShaderImpl* pShader : Shaders)
                {
                    VERIFY(!pShader->IsCompiling(), "All shader compile tasks must have been completed since we used them as "
                                                    "prerequisites for the pipeline initialization task. This appears to be a bug.");
                }
#endif
                try
                {
                    Initialize(static_cast<const PSOCreateInfoType&>(CreateInfo), ArchiveInfo);
                    m_Status.store(PIPELINE_STATE_STATUS_READY);
                }
                catch (...)
                {
                    m_Status.store(PIPELINE_STATE_STATUS_FAILED);
                }

                // Release create info objects
                CreateInfo.Clear();
            });
    }
    else
    {
        Initialize(static_cast<const PSOCreateInfoType&>(CreateInfo), ArchiveInfo);
        m_Status.store(PIPELINE_STATE_STATUS_READY);
    }
}